

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void check_arguments(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  bool has_valid_args;
  allocator local_39;
  string local_38 [8];
  string usage_instructions;
  char **argv_local;
  int argc_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Usage instructions: ",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::operator+=(local_38,*argv);
  std::__cxx11::string::operator+=(local_38," path/to/input.txt output.txt");
  bVar1 = false;
  if (argc == 1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,local_38);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else if (argc == 2) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Please include an output file.\n");
    poVar2 = std::operator<<(poVar2,local_38);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else if (argc == 3) {
    bVar1 = true;
  }
  else if (3 < argc) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Too many arguments.\n");
    poVar2 = std::operator<<(poVar2,local_38);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  if (bVar1) {
    std::__cxx11::string::~string(local_38);
    return;
  }
  exit(1);
}

Assistant:

void check_arguments(int argc, char* argv[]) {
  string usage_instructions = "Usage instructions: ";
  usage_instructions += argv[0];
  usage_instructions += " path/to/input.txt output.txt";

  bool has_valid_args = false;

  // make sure the user has provided input and output files
  if (argc == 1) {
    cerr << usage_instructions << endl;
  } else if (argc == 2) {
    cerr << "Please include an output file.\n" << usage_instructions << endl;
  } else if (argc == 3) {
    has_valid_args = true;
  } else if (argc > 3) {
    cerr << "Too many arguments.\n" << usage_instructions << endl;
  }

  if (!has_valid_args) {
    exit(EXIT_FAILURE);
  }
}